

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

bool __thiscall
Jinx::Impl::Parser::CheckFunctionCallPart
          (Parser *this,FunctionSignaturePartsI *parts,size_t partsIndex,SymbolListCItr currSym,
          SymbolListCItr endSym,FunctionMatch *match)

{
  long *plVar1;
  SymbolType SVar2;
  pointer pFVar3;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *pbVar4;
  _Head_base<2UL,_bool,_false> *p_Var5;
  pointer ptVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
  *this_00;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *__lhs;
  bool bVar12;
  _Head_base<2UL,_bool,_false> *p_Var13;
  _Head_base<2UL,_bool,_false> *p_Var14;
  pointer local_a0;
  Parser *local_98;
  vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
  *local_90;
  SymbolListCItr local_88;
  FunctionMatch newMatch;
  undefined1 local_50 [32];
  
  pFVar3 = (parts->
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(parts->
                 super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3) / 0xc0;
  if (currSym._M_current == endSym._M_current || uVar8 <= partsIndex) {
    return false;
  }
  if (((this->m_error != false) ||
      ((this->m_symbolList->
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
       super__Vector_impl_data._M_finish == currSym._M_current)) ||
     (SVar2 = (currSym._M_current)->type, SVar2 == NewLine)) {
    if (pFVar3[partsIndex].optional != true) {
      return false;
    }
    return uVar8 - 1 == partsIndex;
  }
  local_98 = this;
  local_88._M_current = endSym._M_current;
  if (pFVar3[partsIndex].partType == Name) {
    if (((SVar2 != NameValue) && (pFVar3[partsIndex].optional == false)) &&
       (bVar7 = IsKeyword(SVar2), !bVar7)) {
      return false;
    }
    __lhs = pFVar3[partsIndex].names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = pFVar3[partsIndex].names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (__lhs == pbVar4) {
        if (pFVar3[partsIndex].optional != true) goto LAB_0011cb1c;
        FunctionMatch::FunctionMatch(&newMatch,match);
        local_50[0] = true;
        local_50._8_8_ = 0;
        local_50._16_4_ = Name;
        std::
        vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
        ::emplace_back<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>
                  ((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
                    *)&newMatch.partData,
                   (tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> *)local_50);
        bVar7 = CheckFunctionCallPart(local_98,parts,partsIndex + 1,currSym,local_88,&newMatch);
        if (!bVar7) goto LAB_0011cb17;
        FunctionMatch::operator=(match,&newMatch);
        goto LAB_0011ca80;
      }
      bVar7 = std::operator==(__lhs,&(currSym._M_current)->text);
      __lhs = __lhs + 1;
    } while (!bVar7);
    newMatch.signature._0_1_ = pFVar3[partsIndex].optional;
    newMatch.partData.
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    newMatch.partData.
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    std::
    vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
    ::emplace_back<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>
              ((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
                *)&match->partData,
               (tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> *)&newMatch);
    FunctionMatch::FunctionMatch(&newMatch,match);
    bVar7 = CheckFunctionCallPart
                      (local_98,parts,partsIndex + 1,currSym._M_current + 1,local_88,&newMatch);
    if (bVar7) {
      FunctionMatch::operator=(match,&newMatch);
LAB_0011ca80:
      std::
      _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::~_Vector_base(&newMatch.partData.
                       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                     );
      return true;
    }
LAB_0011cb17:
    std::
    _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ::~_Vector_base(&newMatch.partData.
                     super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                   );
    goto LAB_0011cb1c;
  }
  local_90 = (vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
              *)&match->partData;
  uVar8 = ((long)(match->partData).
                 super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(match->partData).
                super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_a0 = (pointer)0x0;
  bVar7 = CheckVariable(this,currSym,(size_t *)&local_a0);
  if (((bVar7) || (bVar7 = CheckProperty(this,currSym,(size_t *)&local_a0), bVar7)) ||
     (bVar7 = CheckFunctionDeclaration(this,currSym,(size_t *)&local_a0), bVar7)) {
    currSym._M_current = currSym._M_current + (long)local_a0;
    this_00 = local_90;
LAB_0011c87c:
    if (partsIndex < uVar8) goto LAB_0011c887;
    newMatch.signature._0_1_ = 0;
    newMatch.partData.
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
    newMatch.partData.
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_a0;
    std::
    vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
    ::emplace_back<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>
              (this_00,(tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> *)
                       &newMatch);
  }
  else {
    SVar2 = (currSym._M_current)->type;
    if (SVar2 == ParenClose) {
      return false;
    }
    if (SVar2 == ParenOpen) {
      currSym._M_current = currSym._M_current + 1;
      p_Var5 = (_Head_base<2UL,_bool,_false> *)0x1;
      local_a0 = (pointer)p_Var5;
      for (p_Var13 = p_Var5; this_00 = local_90, p_Var13 != (_Head_base<2UL,_bool,_false> *)0x0;
          p_Var13 = p_Var13 + (long)&((_Tuple_impl<2UL,_bool> *)p_Var14)->
                                     super__Head_base<2UL,_bool,_false>) {
        if (local_98->m_error != false) {
          return false;
        }
        if (currSym._M_current ==
            (local_98->m_symbolList->
            super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          return false;
        }
        SVar2 = (currSym._M_current)->type;
        if (SVar2 == NewLine) {
          return false;
        }
        p_Var14 = (_Head_base<2UL,_bool,_false> *)-(ulong)(SVar2 == ParenClose);
        if (SVar2 == ParenOpen) {
          p_Var14 = p_Var5;
        }
        currSym._M_current = currSym._M_current + 1;
        local_a0 = (pointer)((long)&(local_a0->
                                    super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>
                                    ).super__Tuple_impl<1UL,_unsigned_long,_bool> + 1);
      }
      goto LAB_0011c87c;
    }
    bVar7 = IsConstant(SVar2);
    if ((bVar7) || ((currSym._M_current)->type == Not)) {
      currSym._M_current = currSym._M_current + 1;
      local_a0 = (pointer)0x1;
      this_00 = local_90;
      goto LAB_0011c87c;
    }
    if ((uVar8 <= partsIndex) ||
       (((bVar7 = IsOperator((currSym._M_current)->type), !bVar7 &&
         ((currSym._M_current)->type != Or)) && ((currSym._M_current)->type != And)))) {
      if (partsIndex == 0) {
        return false;
      }
      CheckFunctionCall(&newMatch,local_98,false,currSym,local_88);
      if (CONCAT71(newMatch.signature._1_7_,newMatch.signature._0_1_) == 0) {
        CheckFunctionCall((FunctionMatch *)local_50,local_98,true,currSym,local_88);
        FunctionMatch::operator=(&newMatch,(FunctionMatch *)local_50);
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base((_Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         *)(local_50 + 8));
        ptVar6 = local_a0;
        if (CONCAT71(newMatch.signature._1_7_,newMatch.signature._0_1_) == 0) {
          std::
          _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
          ::~_Vector_base(&newMatch.partData.
                           super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         );
          return false;
        }
        for (uVar11 = 1;
            uVar11 < (ulong)((CONCAT44(newMatch.partData.
                                       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       newMatch.partData.
                                       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                             (long)newMatch.partData.
                                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
            uVar11 = uVar11 + 1) {
          currSym._M_current = currSym._M_current + 1;
          local_a0 = (pointer)((long)&(ptVar6->
                                      super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>
                                      ).super__Tuple_impl<1UL,_unsigned_long,_bool> + uVar11);
        }
      }
      else {
        lVar9 = (CONCAT44(newMatch.partData.
                          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                          newMatch.partData.
                          super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                (long)newMatch.partData.
                      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18;
        lVar10 = lVar9;
        ptVar6 = local_a0;
        do {
          local_a0 = ptVar6;
          bVar7 = lVar10 != 0;
          lVar10 = lVar10 + -1;
          ptVar6 = (pointer)((long)&(local_a0->
                                    super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>
                                    ).super__Tuple_impl<1UL,_unsigned_long,_bool> + 1);
        } while (bVar7);
        currSym._M_current = currSym._M_current + lVar9;
      }
      this_00 = local_90;
      std::
      _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::~_Vector_base(&newMatch.partData.
                       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                     );
      goto LAB_0011c87c;
    }
    currSym._M_current = currSym._M_current + 1;
    local_a0 = (pointer)0x1;
    this_00 = local_90;
LAB_0011c887:
    plVar1 = (long *)(*(long *)this_00 + 8 + partsIndex * 0x18);
    *plVar1 = (long)(&(local_a0->
                      super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>
                      ).super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Tuple_impl<2UL,_bool> +
                    *plVar1);
  }
  FunctionMatch::FunctionMatch(&newMatch,match);
  bVar7 = CheckFunctionCallPart(local_98,parts,partsIndex + 1,currSym,local_88,&newMatch);
  if ((bVar7) ||
     (bVar7 = CheckFunctionCallPart(local_98,parts,partsIndex,currSym,local_88,&newMatch), bVar7)) {
    FunctionMatch::operator=(match,&newMatch);
    bVar12 = true;
    bVar7 = false;
  }
  else {
    bVar7 = true;
    bVar12 = false;
  }
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&newMatch.partData.
                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 );
  if (!bVar7) {
    return bVar12;
  }
LAB_0011cb1c:
  return ((long)(match->partData).
                super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)(match->partData).
               super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x18 ==
         ((long)(parts->
                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                )._M_impl.super__Vector_impl_data._M_finish -
         (long)(parts->
               super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
               )._M_impl.super__Vector_impl_data._M_start) / 0xc0;
}

Assistant:

inline_t bool Parser::CheckFunctionCallPart(const FunctionSignaturePartsI & parts, size_t partsIndex, SymbolListCItr currSym, SymbolListCItr endSym, FunctionMatch & match) const
	{
		// If we reach the end of the parts list, return failure
		if (partsIndex >= parts.size())
			return false;

		// If we've exceeded our range, return failure
		if (currSym == endSym)
			return false;

		const auto & part = parts[partsIndex];

		// Check for invalid symbol
		if (!IsSymbolValid(currSym))
			return part.optional && partsIndex == (parts.size() - 1);

		// Recursively iterate through all parts and match them against the signature.
		if (part.partType == FunctionSignaturePartType::Name)
		{
			if (!part.optional && currSym->type != SymbolType::NameValue && !IsKeyword(currSym->type))
				return false;

			// Attempt to find a matching part name
			bool matchedName = false;
			for (const auto & name : part.names)
			{
				if (name == currSym->text)
				{
					matchedName = true;
					match.partData.push_back(std::make_tuple(FunctionSignaturePartType::Name, 1, part.optional));
					auto newCurrSym = currSym;
					++newCurrSym;
					auto newMatch = match;
					if (CheckFunctionCallPart(parts, partsIndex + 1, newCurrSym, endSym, newMatch))
					{
						match = newMatch;
						return true;
					}
					break;
				}
			}

			// Check if this is an optional part and we haven't yet found a name match
			if (!matchedName && part.optional)
			{
				auto newMatch = match;
				newMatch.partData.push_back(std::make_tuple(FunctionSignaturePartType::Name, 0, true));
				if (CheckFunctionCallPart(parts, partsIndex + 1, currSym, endSym, newMatch))
				{
					match = newMatch;
					return true;
				}
			}
		}
		else
		{
			// Set a flag if this is the initial token in the expression.
			bool isInitialToken = partsIndex >= match.partData.size();

			// Check for valid expressions
			size_t symCount = 0;
			if (CheckVariable(currSym, &symCount) || CheckProperty(currSym, &symCount) || CheckFunctionDeclaration(currSym, &symCount))
			{
				for (size_t i = 0; i < symCount; ++i)
					++currSym;
			}
			else if (currSym->type == SymbolType::ParenOpen)
			{
				size_t parenCount = 1;
				symCount = 1;
				while (parenCount)
				{
					++currSym;
					++symCount;
					if (!IsSymbolValid(currSym))
						return false;
					if (currSym->type == SymbolType::ParenOpen)
						++parenCount;
					else if (currSym->type == SymbolType::ParenClose)
						--parenCount;
				}
				++currSym;
			}
			else if (currSym->type == SymbolType::ParenClose)
			{
				return false;
			}
			else if (IsConstant(currSym->type) || currSym->type == SymbolType::Not)
			{
				++currSym;
				symCount = 1;
			}
			else if (!isInitialToken && (IsOperator(currSym->type) || currSym->type == SymbolType::And || currSym->type == SymbolType::Or))
			{
				++currSym;
				symCount = 1;
			}
			else
			{
				if (partsIndex != 0)
				{
					FunctionMatch exprMatch = CheckFunctionCall(false, currSym, endSym);
					if (exprMatch.signature)
					{
						for (size_t i = 0; i < exprMatch.partData.size(); ++i)
						{
							++currSym;
							++symCount;
						}
					}
					else
					{
						exprMatch = CheckFunctionCall(true, currSym, endSym);
						if (exprMatch.signature)
						{
							for (size_t i = 1; i < exprMatch.partData.size(); ++i)
							{
								++currSym;
								++symCount;
							}
						}
						else
						{
							return false;
						}
					}
				}
				else
				{
					return false;
				}
			}

			// If our match structure isn't up to date, push new match items.  Otherwise,
			// advance our expression token count.  This will be important for determining
			// how many symbols we need to parse for an expression.
			if (isInitialToken)
				match.partData.push_back(std::make_tuple(FunctionSignaturePartType::Parameter, symCount, false));
			else
				std::get<1>(match.partData[partsIndex]) = std::get<1>(match.partData[partsIndex]) + symCount;

			// Store off current match structure
			auto newMatch = match;

			// Check to see if advancing part index leads to success
			if (CheckFunctionCallPart(parts, partsIndex + 1, currSym, endSym, newMatch))
			{
				match = newMatch;
				return true;
			}

			// Check symbols against the current part.
			if (CheckFunctionCallPart(parts, partsIndex, currSym, endSym, newMatch))
			{
				match = newMatch;
				return true;
			}
		}

		return match.partData.size() == parts.size();
	}